

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serializer.hpp
# Opt level: O0

void __thiscall
duckdb::Serializer::WritePropertyWithDefault<duckdb::PreserveOrderType>
          (Serializer *this,field_id_t field_id,char *tag,PreserveOrderType *value,
          PreserveOrderType *default_value)

{
  Serializer *in_RCX;
  undefined8 in_RDX;
  undefined2 in_SI;
  long *in_RDI;
  char *in_R8;
  
  if (((*(byte *)((long)in_RDI + 9) & 1) == 0) && (*(char *)&in_RCX->_vptr_Serializer == *in_R8)) {
    (**(code **)(*in_RDI + 0x20))(in_RDI,in_SI,in_RDX,0);
    (**(code **)(*in_RDI + 0x28))(in_RDI,0);
  }
  else {
    (**(code **)(*in_RDI + 0x20))(in_RDI,in_SI,in_RDX,1);
    WriteValue<duckdb::PreserveOrderType>(in_RCX,(PreserveOrderType)((ulong)in_R8 >> 0x38));
    (**(code **)(*in_RDI + 0x28))(in_RDI,1);
  }
  return;
}

Assistant:

void WritePropertyWithDefault(const field_id_t field_id, const char *tag, const T &value, const T &default_value) {
		// If current value is default, don't write it
		if (!options.serialize_default_values && (value == default_value)) {
			OnOptionalPropertyBegin(field_id, tag, false);
			OnOptionalPropertyEnd(false);
			return;
		}
		OnOptionalPropertyBegin(field_id, tag, true);
		WriteValue(value);
		OnOptionalPropertyEnd(true);
	}